

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  uint uVar3;
  stringtable *psVar4;
  GCObject **ppGVar5;
  uint h;
  GCObject *next;
  GCObject *p;
  stringtable *tb;
  int i;
  int newsize_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  psVar4 = &pgVar1->strt;
  luaC_runtilstate(L,-5);
  if ((pgVar1->strt).size < newsize) {
    if (0x1fffffffffffffff < (ulong)(long)(newsize + 1)) {
      luaM_toobig(L);
    }
    ppGVar5 = (GCObject **)
              luaM_realloc_(L,psVar4->hash,(long)(pgVar1->strt).size << 3,(long)newsize << 3);
    psVar4->hash = ppGVar5;
    for (tb._0_4_ = (pgVar1->strt).size; (int)tb < newsize; tb._0_4_ = (int)tb + 1) {
      psVar4->hash[(int)tb] = (GCObject *)0x0;
    }
  }
  for (tb._0_4_ = 0; (int)tb < (pgVar1->strt).size; tb._0_4_ = (int)tb + 1) {
    next = psVar4->hash[(int)tb];
    psVar4->hash[(int)tb] = (GCObject *)0x0;
    while (next != (GCObject *)0x0) {
      pGVar2 = (next->gch).next;
      uVar3 = (next->h).sizearray & newsize - 1U;
      (next->gch).next = psVar4->hash[uVar3];
      psVar4->hash[uVar3] = next;
      (next->gch).marked = (next->gch).marked & 0xbf;
      next = pGVar2;
    }
  }
  if (newsize < (pgVar1->strt).size) {
    if (0x1fffffffffffffff < (ulong)(long)(newsize + 1)) {
      luaM_toobig(L);
    }
    ppGVar5 = (GCObject **)
              luaM_realloc_(L,psVar4->hash,(long)(pgVar1->strt).size << 3,(long)newsize << 3);
    psVar4->hash = ppGVar5;
  }
  (pgVar1->strt).size = newsize;
  return;
}

Assistant:

void luaS_resize (lua_State *L, int newsize) {
  int i;
  stringtable *tb = &G(L)->strt;
  /* cannot resize while GC is traversing strings */
  luaC_runtilstate(L, ~bitmask(GCSsweepstring));
  if (newsize > tb->size) {
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
    for (i = tb->size; i < newsize; i++) tb->hash[i] = NULL;
  }
  /* rehash */
  for (i=0; i<tb->size; i++) {
    GCObject *p = tb->hash[i];
    tb->hash[i] = NULL;
    while (p) {  /* for each node in the list */
      GCObject *next = gch(p)->next;  /* save next */
      unsigned int h = lmod(gco2ts(p)->hash, newsize);  /* new position */
      gch(p)->next = tb->hash[h];  /* chain it */
      tb->hash[h] = p;
      resetoldbit(p);  /* see MOVE OLD rule */
      p = next;
    }
  }
  if (newsize < tb->size) {
    /* shrinking slice must be empty */
    lua_assert(tb->hash[newsize] == NULL && tb->hash[tb->size - 1] == NULL);
    luaM_reallocvector(L, tb->hash, tb->size, newsize, GCObject *);
  }
  tb->size = newsize;
}